

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclaredType.cpp
# Opt level: O2

void __thiscall
slang::ast::DeclaredType::resolveType
          (DeclaredType *this,ASTContext *typeContext,ASTContext *initializerContext)

{
  uint uVar1;
  Compilation *this_00;
  DeclaredType *this_01;
  SyntaxList<slang::syntax::VariableDimensionSyntax> *dimensions;
  SourceLocation SVar2;
  bool bVar3;
  Type *pTVar4;
  Type *elementType;
  SourceRange SVar5;
  undefined1 local_68 [56];
  
  this_00 = ((typeContext->scope).ptr)->compilation;
  this_01 = (DeclaredType *)(this->typeOrLink).typeSyntax;
  if ((int)*(uint *)&this->field_0x3c < 0) {
    pTVar4 = getType(this_01);
    this->type = pTVar4;
    if (this->dimensions == (SyntaxList<slang::syntax::VariableDimensionSyntax> *)0x0) {
      return;
    }
    pTVar4 = Compilation::getType(this_00,pTVar4,this->dimensions,typeContext);
LAB_00278532:
    this->type = pTVar4;
    return;
  }
  if (this_01 == (DeclaredType *)0x0) {
    pTVar4 = this_00->errorType;
    goto LAB_00278532;
  }
  *(uint *)&this->field_0x3c = *(uint *)&this->field_0x3c | 0x40000000;
  uVar1 = (this->flags).m_bits;
  if ((uVar1 & 1) == 0 || *(int *)&this_01->parent != 0xf7) {
    if ((short)uVar1 < 0) {
      pTVar4 = Compilation::getType(this_00,Untyped);
      this->type = pTVar4;
      if ((*(int *)&this_01->parent == 0xf7) &&
         (this_01[1].dimensions != (SyntaxList<slang::syntax::VariableDimensionSyntax> *)0x0)) {
        ASTContext::resetFlags
                  ((ASTContext *)local_68,typeContext,(bitmask<slang::ast::ASTFlags>)0x80000000);
        pTVar4 = Compilation::getType
                           (this_00,pTVar4,
                            (SyntaxList<slang::syntax::VariableDimensionSyntax> *)
                            &this_01->initializerSyntax,(ASTContext *)local_68);
        this->type = pTVar4;
      }
      dimensions = this->dimensions;
      if (dimensions != (SyntaxList<slang::syntax::VariableDimensionSyntax> *)0x0) {
        ASTContext::resetFlags
                  ((ASTContext *)local_68,typeContext,(bitmask<slang::ast::ASTFlags>)0x80000000);
        pTVar4 = Compilation::getType(this_00,pTVar4,dimensions,(ASTContext *)local_68);
        this->type = pTVar4;
      }
      goto LAB_0027870a;
    }
    if ((uVar1 & 0x20) == 0) {
      pTVar4 = (Type *)0x0;
    }
    else {
      pTVar4 = (Type *)this->parent;
      if ((pTVar4->super_Symbol).kind == TypeParameter) {
        pTVar4 = (Type *)pTVar4[2].super_Symbol.name._M_str;
      }
    }
    elementType = Compilation::getType(this_00,(DataTypeSyntax *)this_01,typeContext,pTVar4);
    this->type = elementType;
    if (this->dimensions != (SyntaxList<slang::syntax::VariableDimensionSyntax> *)0x0) {
      elementType = Compilation::getType(this_00,elementType,this->dimensions,typeContext);
      this->type = elementType;
    }
    if (pTVar4 != (Type *)0x0) {
      Type::getCanonicalType(elementType);
    }
  }
  else {
    if (this->dimensions == (SyntaxList<slang::syntax::VariableDimensionSyntax> *)0x0) {
      if ((SourceLocation)this->initializerSyntax == (SourceLocation)0x0) goto LAB_002786dd;
      SVar2 = this->initializerLocation;
      SVar5.endLoc = SVar2;
      SVar5.startLoc = (SourceLocation)this->initializerSyntax;
      Expression::bindImplicitParam
                ((DataTypeSyntax *)local_68,(ExpressionSyntax *)this_01,SVar5,
                 (ASTContext *)
                 ((long)SVar2 * 0x10 + 0x100000000 >> 4 & 0xfffffffff0000000U |
                 (ulong)(SVar2._0_4_ & 0xfffffff)),initializerContext,
                 (bitmask<slang::ast::ASTFlags>)typeContext);
      this->initializer = (Expression *)local_68._8_8_;
    }
    else if ((this_01->initializer == (Expression *)0x0) &&
            (this_01[1].dimensions == (SyntaxList<slang::syntax::VariableDimensionSyntax> *)0x0)) {
      SVar5 = slang::syntax::SyntaxNode::sourceRange
                        (&(this->dimensions->super_SyntaxListBase).super_SyntaxNode);
      ASTContext::addDiag(typeContext,(DiagCode)0xd30006,SVar5);
LAB_002786dd:
      local_68._0_8_ = this_00->errorType;
    }
    else {
      pTVar4 = Compilation::getType(this_00,(DataTypeSyntax *)this_01,typeContext,(Type *)0x0);
      this->type = pTVar4;
      local_68._0_8_ = Compilation::getType(this_00,pTVar4,this->dimensions,typeContext);
    }
    this->type = (Type *)local_68._0_8_;
  }
  if ((((this->flags).m_bits & 0x16fc0) != 0) && (bVar3 = Type::isError(this->type), !bVar3)) {
    checkType(this,initializerContext);
  }
LAB_0027870a:
  this->field_0x3f = this->field_0x3f & 0xbf;
  return;
}

Assistant:

void DeclaredType::resolveType(const ASTContext& typeContext,
                               const ASTContext& initializerContext) const {
    auto& comp = typeContext.getCompilation();
    if (hasLink) {
        SLANG_ASSERT(typeOrLink.link);
        type = &typeOrLink.link->getType();
        if (dimensions)
            type = &comp.getType(*type, *dimensions, typeContext);
        return;
    }

    auto syntax = typeOrLink.typeSyntax;
    SLANG_ASSERT(syntax);
    if (!syntax) {
        type = &comp.getErrorType();
        return;
    }

    SLANG_ASSERT(!evaluating);
    evaluating = true;
    auto guard = ScopeGuard([this] { evaluating = false; });

    // If we are configured to infer implicit types, bind the initializer expression
    // first so that we can derive our type from whatever that happens to be.
    if (syntax->kind == SyntaxKind::ImplicitType && flags.has(DeclaredTypeFlags::InferImplicit)) {
        if (dimensions) {
            auto& its = syntax->as<ImplicitTypeSyntax>();
            if (its.signing || !its.dimensions.empty()) {
                type = &comp.getType(*syntax, typeContext, nullptr);
                type = &comp.getType(*type, *dimensions, typeContext);
            }
            else {
                typeContext.addDiag(diag::UnpackedArrayParamType, dimensions->sourceRange());
                type = &comp.getErrorType();
            }
        }
        else if (!initializerSyntax) {
            type = &comp.getErrorType();
        }
        else {
            bitmask<ASTFlags> extraFlags;
            if (flags.has(DeclaredTypeFlags::AllowUnboundedLiteral))
                extraFlags = ASTFlags::AllowUnboundedLiteral;

            std::tie(initializer, type) = Expression::bindImplicitParam(
                *syntax, *initializerSyntax, {initializerLocation, initializerLocation + 1},
                initializerContext, typeContext, extraFlags);
            SLANG_ASSERT(initializer);
        }
    }
    else if (flags.has(DeclaredTypeFlags::InterconnectNet)) {
        // An interconnect net is always untyped (or some array of untyped elements).
        type = &comp.getType(SyntaxKind::Untyped);
        if (syntax->kind == SyntaxKind::ImplicitType) {
            // This should always be an implicit type unless there's an
            // error (diagnosed by the parser).
            auto& its = syntax->as<ImplicitTypeSyntax>();
            if (!its.dimensions.empty())
                type = &comp.getType(*type, its.dimensions,
                                     typeContext.resetFlags(ASTFlags::AllowInterconnect));
        }

        if (dimensions) {
            type = &comp.getType(*type, *dimensions,
                                 typeContext.resetFlags(ASTFlags::AllowInterconnect));
        }

        // Return early to skip additional checks for net types.
        return;
    }
    else {
        const Type* typedefTarget = nullptr;
        if (flags.has(DeclaredTypeFlags::TypedefTarget)) {
            if (parent.kind == SymbolKind::TypeParameter)
                typedefTarget = &parent.as<TypeParameterSymbol>().getTypeAlias();
            else
                typedefTarget = &parent.as<Type>();
        }

        type = &comp.getType(*syntax, typeContext, typedefTarget);
        if (dimensions)
            type = &comp.getType(*type, *dimensions, typeContext);

        if (typedefTarget) {
            // When resolving a typedef target we need to force resolution
            // of the canonical type to make sure there are no cycles.
            type->getCanonicalType();
        }
    }

    if (flags.has(DeclaredTypeFlags::NeedsTypeCheck) && !type->isError())
        checkType(initializerContext);
}